

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_zp_boundary.cpp
# Opt level: O2

void __thiscall
Boundary_matrix_zp_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::test_method(Boundary_matrix_zp_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
              *this)

{
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>
              *)&m,&columns,5);
  test_non_base_row_access<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>
            (&m);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_matrix_zp_row_access, Matrix, row_access_matrices) {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);
  test_non_base_row_access<Matrix>(m);
}